

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_method.cc
# Opt level: O0

bool __thiscall
bssl::tls_set_write_state
          (bssl *this,SSL *ssl,ssl_encryption_level_t level,UniquePtr<SSLAEADContext> *aead_ctx,
          Span<const_unsigned_char> traffic_secret)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  pointer pSVar4;
  pointer this_00;
  SSL_CIPHER *pSVar5;
  uchar *puVar6;
  size_t sVar7;
  undefined4 in_register_00000014;
  UniquePtr<SSLAEADContext> *aead_ctx_local;
  ssl_encryption_level_t level_local;
  SSL *ssl_local;
  Span<const_unsigned_char> traffic_secret_local;
  
  traffic_secret_local.data_ = traffic_secret.data_;
  ssl_local = (SSL *)aead_ctx;
  bVar2 = tls_flush_pending_hs_data((SSL *)this);
  if (!bVar2) {
    return false;
  }
  iVar3 = SSL_is_quic((SSL *)this);
  if (iVar3 != 0) {
    bVar2 = std::operator==((unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter> *)
                            (*(long *)(this + 0x30) + 0x118),(nullptr_t)0x0);
    if ((bVar2) ||
       (pSVar4 = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::operator->
                           ((unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter> *)
                            (*(long *)(this + 0x30) + 0x118)),
       (*(uint *)&pSVar4->field_0x6c8 >> 0x14 & 1) == 0)) {
      pcVar1 = *(code **)(*(long *)(this + 0x98) + 8);
      this_00 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                          ((unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> *)
                           CONCAT44(in_register_00000014,level));
      pSVar5 = SSLAEADContext::cipher(this_00);
      puVar6 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&ssl_local);
      sVar7 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&ssl_local);
      iVar3 = (*pcVar1)(this,(ulong)ssl & 0xffffffff,pSVar5,puVar6,sVar7);
      if (iVar3 == 0) {
        return false;
      }
    }
    if ((int)ssl == 1) {
      return true;
    }
    *(int *)(*(long *)(this + 0x30) + 0xcc) = (int)ssl;
  }
  *(undefined8 *)(*(long *)(this + 0x30) + 8) = 0;
  std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator=
            ((unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> *)
             (*(long *)(this + 0x30) + 0x110),
             (unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> *)
             CONCAT44(in_register_00000014,level));
  return true;
}

Assistant:

static bool tls_set_write_state(SSL *ssl, ssl_encryption_level_t level,
                                UniquePtr<SSLAEADContext> aead_ctx,
                                Span<const uint8_t> traffic_secret) {
  if (!tls_flush_pending_hs_data(ssl)) {
    return false;
  }

  if (SSL_is_quic(ssl)) {
    if ((ssl->s3->hs == nullptr || !ssl->s3->hs->hints_requested) &&
        !ssl->quic_method->set_write_secret(ssl, level, aead_ctx->cipher(),
                                            traffic_secret.data(),
                                            traffic_secret.size())) {
      return false;
    }

    // QUIC only uses |ssl| for handshake messages, which never use early data
    // keys, so we return without installing anything. This avoids needing to
    // have two secrets active at once in 0-RTT.
    if (level == ssl_encryption_early_data) {
      return true;
    }
    ssl->s3->quic_write_level = level;
  }

  ssl->s3->write_sequence = 0;
  ssl->s3->aead_write_ctx = std::move(aead_ctx);
  return true;
}